

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groupnorm.cpp
# Opt level: O0

int __thiscall ncnn::GroupNorm::forward_inplace(GroupNorm *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  long *in_RSI;
  long in_RDI;
  long lVar12;
  long lVar13;
  float fVar14;
  int i_5;
  float *ptr_5;
  float beta_2;
  float gamma_2;
  float b_2;
  float a_2;
  int q_8;
  float var_2;
  float tmp_2;
  int i_4;
  float *ptr_4;
  int q_7;
  float sqsum_2;
  float mean_2;
  int i_3;
  float *ptr_3;
  int q_6;
  float sum_2;
  Mat beta_data_g_2;
  Mat gamma_data_g_2;
  Mat bottom_top_blob_g_2;
  int g_2;
  int size;
  int d;
  int h;
  int w_1;
  int i_2;
  float *ptr_2;
  float beta_1;
  float gamma_1;
  float b_1;
  float a_1;
  int q_5;
  float var_1;
  float tmp_1;
  int i_1;
  float *ptr_1;
  int q_4;
  float sqsum_1;
  float mean_1;
  int i;
  float *ptr;
  int q_3;
  float sum_1;
  Mat beta_data_g_1;
  Mat gamma_data_g_1;
  Mat bottom_top_blob_g_1;
  int g_1;
  int w;
  float beta;
  float gamma;
  float b;
  float a;
  int q_2;
  float var;
  float tmp;
  int q_1;
  float sqsum;
  float mean;
  int q;
  float sum;
  Mat beta_data_g;
  Mat gamma_data_g;
  Mat bottom_top_blob_g;
  int g;
  int channels_per_group;
  int dims;
  Mat *m;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  int local_cbc;
  float local_c60;
  float local_c5c;
  int local_c58;
  int local_c4c;
  int local_bf8;
  float local_bf4;
  int local_bec;
  int local_b98;
  float local_b94;
  int local_ab8;
  int local_aa4;
  float local_a90;
  float local_a8c;
  int local_a88;
  int local_a7c;
  int local_a70;
  float local_a6c;
  int local_a64;
  int local_a58;
  float local_a54;
  int local_978;
  float local_968;
  float local_964;
  int local_960;
  int local_954;
  float local_950;
  int local_948;
  float local_944;
  int local_854;
  
  iVar9 = (int)in_RSI[5];
  iVar8 = *(int *)(in_RDI + 0xd4) / *(int *)(in_RDI + 0xd0);
  if (iVar9 == 1) {
    for (local_854 = 0; local_854 < *(int *)(in_RDI + 0xd0); local_854 = local_854 + 1) {
      lVar12 = *in_RSI + (long)(local_854 * iVar8) * in_RSI[2];
      lVar3 = *(long *)(in_RDI + 0xe0);
      lVar4 = *(long *)(in_RDI + 0xf0);
      lVar5 = *(long *)(in_RDI + 0x128);
      lVar6 = *(long *)(in_RDI + 0x138);
      local_944 = 0.0;
      for (local_948 = 0; local_948 < iVar8; local_948 = local_948 + 1) {
        local_944 = *(float *)(lVar12 + (long)local_948 * 4) + local_944;
      }
      local_944 = local_944 / (float)iVar8;
      local_950 = 0.0;
      for (local_954 = 0; local_954 < iVar8; local_954 = local_954 + 1) {
        fVar14 = *(float *)(lVar12 + (long)local_954 * 4) - local_944;
        local_950 = fVar14 * fVar14 + local_950;
      }
      for (local_960 = 0; local_960 < iVar8; local_960 = local_960 + 1) {
        if (*(int *)(in_RDI + 0xdc) == 0) {
          local_964 = 1.0 / SQRT(local_950 / (float)iVar8 + *(float *)(in_RDI + 0xd8));
          local_968 = -local_944 * local_964;
        }
        else {
          local_964 = *(float *)(lVar3 + (local_854 * iVar8) * lVar4 + (long)local_960 * 4) /
                      SQRT(local_950 / (float)iVar8 + *(float *)(in_RDI + 0xd8));
          local_968 = -local_944 * local_964 +
                      *(float *)(lVar5 + (local_854 * iVar8) * lVar6 + (long)local_960 * 4);
        }
        *(float *)(lVar12 + (long)local_960 * 4) =
             *(float *)(lVar12 + (long)local_960 * 4) * local_964 + local_968;
      }
    }
  }
  if (iVar9 == 2) {
    iVar1 = *(int *)((long)in_RSI + 0x2c);
    for (local_978 = 0; local_978 < *(int *)(in_RDI + 0xd0); local_978 = local_978 + 1) {
      iVar2 = *(int *)((long)in_RSI + 0x2c);
      lVar13 = *in_RSI + (long)*(int *)((long)in_RSI + 0x2c) * (long)(local_978 * iVar8) * in_RSI[2]
      ;
      lVar3 = in_RSI[2];
      lVar4 = *(long *)(in_RDI + 0xe0);
      lVar5 = *(long *)(in_RDI + 0xf0);
      lVar6 = *(long *)(in_RDI + 0x128);
      lVar12 = *(long *)(in_RDI + 0x138);
      local_a54 = 0.0;
      for (local_a58 = 0; local_a58 < iVar8; local_a58 = local_a58 + 1) {
        for (local_a64 = 0; local_a64 < iVar1; local_a64 = local_a64 + 1) {
          local_a54 = *(float *)(lVar13 + (long)iVar2 * (long)local_a58 * lVar3 +
                                (long)local_a64 * 4) + local_a54;
        }
      }
      local_a54 = local_a54 / (float)(iVar8 * iVar1);
      local_a6c = 0.0;
      for (local_a70 = 0; local_a70 < iVar8; local_a70 = local_a70 + 1) {
        for (local_a7c = 0; local_a7c < iVar1; local_a7c = local_a7c + 1) {
          fVar14 = *(float *)(lVar13 + (long)iVar2 * (long)local_a70 * lVar3 + (long)local_a7c * 4)
                   - local_a54;
          local_a6c = fVar14 * fVar14 + local_a6c;
        }
      }
      local_a6c = local_a6c / (float)(iVar8 * iVar1);
      for (local_a88 = 0; local_a88 < iVar8; local_a88 = local_a88 + 1) {
        if (*(int *)(in_RDI + 0xdc) == 0) {
          local_a8c = 1.0 / SQRT(local_a6c + *(float *)(in_RDI + 0xd8));
          local_a90 = -local_a54 * local_a8c;
        }
        else {
          local_a8c = *(float *)(lVar4 + (local_978 * iVar8) * lVar5 + (long)local_a88 * 4) /
                      SQRT(local_a6c + *(float *)(in_RDI + 0xd8));
          local_a90 = -local_a54 * local_a8c +
                      *(float *)(lVar6 + (local_978 * iVar8) * lVar12 + (long)local_a88 * 4);
        }
        lVar10 = lVar13 + (long)iVar2 * (long)local_a88 * lVar3;
        for (local_aa4 = 0; local_aa4 < iVar1; local_aa4 = local_aa4 + 1) {
          *(float *)(lVar10 + (long)local_aa4 * 4) =
               *(float *)(lVar10 + (long)local_aa4 * 4) * local_a8c + local_a90;
        }
      }
    }
  }
  if ((iVar9 == 3) || (iVar9 == 4)) {
    iVar9 = *(int *)((long)in_RSI + 0x2c) * (int)in_RSI[6] * *(int *)((long)in_RSI + 0x34);
    for (local_ab8 = 0; local_ab8 < *(int *)(in_RDI + 0xd0); local_ab8 = local_ab8 + 1) {
      lVar12 = *in_RSI + in_RSI[8] * (long)(local_ab8 * iVar8) * in_RSI[2];
      uVar7 = in_RSI[2];
      uVar11 = ((long)*(int *)((long)in_RSI + 0x2c) * (long)(int)in_RSI[6] *
                (long)*(int *)((long)in_RSI + 0x34) * uVar7 + 0xf & 0xfffffffffffffff0) / uVar7;
      lVar3 = *(long *)(in_RDI + 0xe0);
      lVar4 = *(long *)(in_RDI + 0xf0);
      lVar5 = *(long *)(in_RDI + 0x128);
      lVar6 = *(long *)(in_RDI + 0x138);
      local_b94 = 0.0;
      for (local_b98 = 0; local_b98 < iVar8; local_b98 = local_b98 + 1) {
        for (local_bec = 0; local_bec < iVar9; local_bec = local_bec + 1) {
          local_b94 = *(float *)(lVar12 + uVar11 * (long)local_b98 * uVar7 + (long)local_bec * 4) +
                      local_b94;
        }
      }
      local_b94 = local_b94 / (float)(iVar8 * iVar9);
      local_bf4 = 0.0;
      for (local_bf8 = 0; local_bf8 < iVar8; local_bf8 = local_bf8 + 1) {
        for (local_c4c = 0; local_c4c < iVar9; local_c4c = local_c4c + 1) {
          fVar14 = *(float *)(lVar12 + uVar11 * (long)local_bf8 * uVar7 + (long)local_c4c * 4) -
                   local_b94;
          local_bf4 = fVar14 * fVar14 + local_bf4;
        }
      }
      local_bf4 = local_bf4 / (float)(iVar8 * iVar9);
      for (local_c58 = 0; local_c58 < iVar8; local_c58 = local_c58 + 1) {
        if (*(int *)(in_RDI + 0xdc) == 0) {
          local_c5c = 1.0 / SQRT(local_bf4 + *(float *)(in_RDI + 0xd8));
          local_c60 = -local_b94 * local_c5c;
        }
        else {
          local_c5c = *(float *)(lVar3 + (local_ab8 * iVar8) * lVar4 + (long)local_c58 * 4) /
                      SQRT(local_bf4 + *(float *)(in_RDI + 0xd8));
          local_c60 = -local_b94 * local_c5c +
                      *(float *)(lVar5 + (local_ab8 * iVar8) * lVar6 + (long)local_c58 * 4);
        }
        lVar13 = lVar12 + uVar11 * (long)local_c58 * uVar7;
        for (local_cbc = 0; local_cbc < iVar9; local_cbc = local_cbc + 1) {
          *(float *)(lVar13 + (long)local_cbc * 4) =
               *(float *)(lVar13 + (long)local_cbc * 4) * local_c5c + local_c60;
        }
      }
    }
  }
  return 0;
}

Assistant:

int GroupNorm::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    const int dims = bottom_top_blob.dims;
    const int channels_per_group = channels / group;

    if (dims == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            // mean and var
            float sum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                sum += bottom_top_blob_g[q];
            }
            float mean = sum / channels_per_group;

            float sqsum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                float tmp = bottom_top_blob_g[q] - mean;
                sqsum += tmp * tmp;
            }
            float var = sqsum / channels_per_group;

            for (int q = 0; q < channels_per_group; q++)
            {
                float a;
                float b;
                if (affine)
                {
                    float gamma = gamma_data_g[q];
                    float beta = beta_data_g[q];

                    a = gamma / sqrtf(var + eps);
                    b = -mean * a + beta;
                }
                else
                {
                    a = 1.f / (sqrtf(var + eps));
                    b = -mean * a;
                }

                bottom_top_blob_g[q] = bottom_top_blob_g[q] * a + b;
            }
        }
    }

    if (dims == 2)
    {
        int w = bottom_top_blob.w;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.row_range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            // mean and var
            float sum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.row(q);
                for (int i = 0; i < w; i++)
                {
                    sum += ptr[i];
                }
            }
            float mean = sum / (channels_per_group * w);

            float sqsum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.row(q);
                for (int i = 0; i < w; i++)
                {
                    float tmp = ptr[i] - mean;
                    sqsum += tmp * tmp;
                }
            }
            float var = sqsum / (channels_per_group * w);

            for (int q = 0; q < channels_per_group; q++)
            {
                float a;
                float b;
                if (affine)
                {
                    float gamma = gamma_data_g[q];
                    float beta = beta_data_g[q];

                    a = gamma / sqrtf(var + eps);
                    b = -mean * a + beta;
                }
                else
                {
                    a = 1.f / (sqrtf(var + eps));
                    b = -mean * a;
                }

                float* ptr = bottom_top_blob_g.row(q);
                for (int i = 0; i < w; i++)
                {
                    ptr[i] = ptr[i] * a + b;
                }
            }
        }
    }

    if (dims == 3 || dims == 4)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int d = bottom_top_blob.d;
        int size = w * h * d;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.channel_range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            // mean and var
            float sum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.channel(q);
                for (int i = 0; i < size; i++)
                {
                    sum += ptr[i];
                }
            }
            float mean = sum / (channels_per_group * size);

            float sqsum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.channel(q);
                for (int i = 0; i < size; i++)
                {
                    float tmp = ptr[i] - mean;
                    sqsum += tmp * tmp;
                }
            }
            float var = sqsum / (channels_per_group * size);

            for (int q = 0; q < channels_per_group; q++)
            {
                float a;
                float b;
                if (affine)
                {
                    float gamma = gamma_data_g[q];
                    float beta = beta_data_g[q];

                    a = gamma / sqrtf(var + eps);
                    b = -mean * a + beta;
                }
                else
                {
                    a = 1.f / (sqrtf(var + eps));
                    b = -mean * a;
                }

                float* ptr = bottom_top_blob_g.channel(q);
                for (int i = 0; i < size; i++)
                {
                    ptr[i] = ptr[i] * a + b;
                }
            }
        }
    }

    return 0;
}